

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O2

void __thiscall
duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>
          (duckdb *this,Vector *constant,Vector *other,Vector *result,DataChunk *args)

{
  VectorType VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *count;
  double *pdVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  unsigned_long *puVar4;
  idx_t iVar5;
  sel_t *psVar6;
  SelectionVector *pSVar7;
  string *psVar8;
  reference other_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  Vector *idx;
  ValidityMask *pVVar11;
  ValidityMask *pVVar12;
  ValidityMask *pVVar13;
  idx_t i_2;
  data_ptr_t pdVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  ulong uVar17;
  data_ptr_t pdVar18;
  data_ptr_t pdVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t i;
  double dVar22;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  value_type score_cutoff;
  UnifiedVectorFormat ldata;
  CachedJaroWinklerSimilarity<char> cached;
  string str_val;
  UnifiedVectorFormat local_b8;
  Value val;
  undefined7 uVar14;
  
  idx = result;
  Vector::GetValue(&val,(Vector *)this,0);
  count = (result->type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (val.is_null == true) {
    FlatVector::VerifyFlatVector(other);
    TemplatedValidityMask<unsigned_long>::SetAllInvalid
              (&(other->validity).super_TemplatedValidityMask<unsigned_long>,(idx_t)count);
    goto LAB_00d620fa;
  }
  psVar8 = StringValue::Get_abi_cxx11_(&val);
  ::std::__cxx11::string::string((string *)&str_val,(string *)psVar8);
  duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>::
  CachedJaroWinklerSimilarity<std::__cxx11::string>(&cached,&str_val,0.1);
  if (*(long *)&result->type - *(long *)result == 0xd0) {
    ldata.sel = (SelectionVector *)&cached;
    if (constant->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(other,FLAT_VECTOR);
      pdVar18 = other->data;
      pdVar19 = constant->data;
      FlatVector::VerifyFlatVector(constant);
      FlatVector::VerifyFlatVector(other);
      pVVar11 = &constant->validity;
      if ((pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        pdVar19 = pdVar19 + 8;
        for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
          input_02.value.pointer.ptr = (char *)*(undefined8 *)pdVar19;
          input_02.value._0_8_ = *(undefined8 *)(pdVar19 + -8);
          dVar22 = UnaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                             (input_02,(ValidityMask *)&ldata,(idx_t)idx,args);
          *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
          pdVar19 = pdVar19 + 0x10;
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&(other->validity).super_TemplatedValidityMask<unsigned_long>,
                   &pVVar11->super_TemplatedValidityMask<unsigned_long>);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        for (uVar21 = 0; uVar21 != (ulong)((long)&count[3]._M_weak_count + 3U) >> 6;
            uVar21 = uVar21 + 1) {
          puVar4 = (pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            p_Var9 = p_Var16 + 4;
            if (count <= p_Var16 + 4) {
              p_Var9 = count;
            }
LAB_00d61d8f:
            pdVar15 = pdVar19 + (long)p_Var16 * 0x10 + 8;
            for (; p_Var10 = p_Var16, p_Var16 < p_Var9;
                p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
              input.value.pointer.ptr = (char *)*(undefined8 *)pdVar15;
              input.value._0_8_ = *(undefined8 *)(pdVar15 + -8);
              dVar22 = UnaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                                 (input,(ValidityMask *)&ldata,(idx_t)idx,args);
              *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
              pdVar15 = pdVar15 + 0x10;
            }
          }
          else {
            uVar17 = puVar4[uVar21];
            p_Var9 = p_Var16 + 4;
            if (count <= p_Var16 + 4) {
              p_Var9 = count;
            }
            if (uVar17 == 0xffffffffffffffff) goto LAB_00d61d8f;
            p_Var10 = p_Var9;
            if (uVar17 != 0) {
              pdVar15 = pdVar19 + (long)p_Var16 * 0x10 + 8;
              for (uVar20 = 0;
                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var16->_vptr__Sp_counted_base + uVar20), p_Var10 < p_Var9;
                  uVar20 = uVar20 + 1) {
                if ((uVar17 >> (uVar20 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar15;
                  input_00.value._0_8_ = *(undefined8 *)(pdVar15 + -8);
                  dVar22 = UnaryLambdaWrapper::
                           Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                                     (input_00,(ValidityMask *)&ldata,(idx_t)idx,args);
                  *(double *)(pdVar18 + uVar20 * 8 + (long)p_Var16 * 8) = dVar22;
                }
                pdVar15 = pdVar15 + 0x10;
              }
            }
          }
          p_Var16 = p_Var10;
        }
      }
    }
    else if (constant->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(other,CONSTANT_VECTOR);
      pdVar2 = (double *)other->data;
      paVar3 = (anon_union_16_2_67f50693_for_value *)constant->data;
      puVar4 = (constant->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        ConstantVector::SetNull(other,false);
        dVar22 = UnaryLambdaWrapper::
                 Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                           ((string_t)paVar3->pointer,(ValidityMask *)&ldata,(idx_t)idx,args);
        *pdVar2 = dVar22;
      }
      else {
        ConstantVector::SetNull(other,true);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&score_cutoff);
      Vector::ToUnifiedFormat(constant,(idx_t)count,(UnifiedVectorFormat *)&score_cutoff);
      Vector::SetVectorType(other,FLAT_VECTOR);
      pdVar18 = other->data;
      FlatVector::VerifyFlatVector(other);
      if (score_cutoff.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
          iVar5 = *(idx_t *)CONCAT71(score_cutoff._1_7_,score_cutoff.vector_type);
          p_Var9 = p_Var16;
          if (iVar5 != 0) {
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (ulong)*(uint *)(iVar5 + (long)p_Var16 * 4);
          }
          input_03.value.pointer.ptr =
               (char *)*(undefined8 *)(score_cutoff.type._0_8_ + 8 + (long)p_Var9 * 0x10);
          input_03.value._0_8_ = *(undefined8 *)(score_cutoff.type._0_8_ + (long)p_Var9 * 0x10);
          dVar22 = UnaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                             (input_03,(ValidityMask *)&ldata,iVar5,args);
          *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
        }
      }
      else {
        for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
          iVar5 = *(idx_t *)CONCAT71(score_cutoff._1_7_,score_cutoff.vector_type);
          p_Var9 = p_Var16;
          if (iVar5 != 0) {
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (ulong)*(uint *)(iVar5 + (long)p_Var16 * 4);
          }
          if (((ulong)(&(score_cutoff.type.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->_vptr_ExtraTypeInfo)[(ulong)p_Var9 >> 6] >> ((ulong)p_Var9 & 0x3f)
              & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(other->validity).super_TemplatedValidityMask<unsigned_long>,(idx_t)p_Var16)
            ;
          }
          else {
            input_01.value.pointer.ptr =
                 (char *)*(undefined8 *)(score_cutoff.type._0_8_ + 8 + (long)p_Var9 * 0x10);
            input_01.value._0_8_ = *(undefined8 *)(score_cutoff.type._0_8_ + (long)p_Var9 * 0x10);
            dVar22 = UnaryLambdaWrapper::
                     Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                               (input_01,(ValidityMask *)&ldata,
                                (idx_t)(&(score_cutoff.type.type_info_.internal.
                                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->_vptr_ExtraTypeInfo)[(ulong)p_Var9 >> 6],args);
            *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&score_cutoff);
    }
  }
  else {
    other_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)result,2);
    Vector::Vector(&score_cutoff,other_00);
    VVar1 = constant->vector_type;
    uVar14 = (undefined7)((ulong)idx >> 8);
    pVVar11 = (ValidityMask *)CONCAT71(uVar14,score_cutoff.vector_type);
    if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR &&
        (score_cutoff.vector_type ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(other,CONSTANT_VECTOR);
      puVar4 = (constant->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar2 = (double *)other->data;
      if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
         ((score_cutoff.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((*score_cutoff.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) !=
           0)))) {
        dVar22 = BinaryLambdaWrapper::
                 Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                           (&cached,(string_t)
                                    ((anon_union_16_2_67f50693_for_value *)constant->data)->pointer,
                            *(double *)score_cutoff.data,(ValidityMask *)score_cutoff.data,
                            (idx_t)args);
        *pdVar2 = dVar22;
      }
      else {
LAB_00d61f1e:
        ConstantVector::SetNull(other,true);
      }
    }
    else if ((score_cutoff.vector_type ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar18 = constant->data;
      if ((score_cutoff.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((*score_cutoff.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) == 0
         )) {
LAB_00d61f13:
        Vector::SetVectorType(other,CONSTANT_VECTOR);
        goto LAB_00d61f1e;
      }
      Vector::SetVectorType(other,FLAT_VECTOR);
      pdVar19 = other->data;
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(constant);
      FlatVector::SetValidity(other,&constant->validity);
      if ((other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        pdVar18 = pdVar18 + 8;
        for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
          left_02.value.pointer.ptr = (char *)*(undefined8 *)pdVar18;
          left_02.value._0_8_ = *(undefined8 *)(pdVar18 + -8);
          dVar22 = BinaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                             (&cached,left_02,*(double *)score_cutoff.data,pVVar11,(idx_t)args);
          *(double *)(pdVar19 + (long)p_Var16 * 8) = dVar22;
          pdVar18 = pdVar18 + 0x10;
        }
      }
      else {
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        for (pVVar11 = (ValidityMask *)0x0;
            pVVar11 != (ValidityMask *)((ulong)((long)&count[3]._M_weak_count + 3U) >> 6);
            pVVar11 = (ValidityMask *)
                      ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1)) {
          puVar4 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            p_Var9 = p_Var16 + 4;
            if (count <= p_Var16 + 4) {
              p_Var9 = count;
            }
LAB_00d61c26:
            pdVar15 = pdVar18 + (long)p_Var16 * 0x10 + 8;
            pVVar12 = pVVar11;
            for (; p_Var10 = p_Var16, p_Var16 < p_Var9;
                p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
              left.value.pointer.ptr = (char *)*(undefined8 *)pdVar15;
              left.value._0_8_ = *(undefined8 *)(pdVar15 + -8);
              dVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                 (&cached,left,*(double *)score_cutoff.data,pVVar12,(idx_t)args);
              *(double *)(pdVar19 + (long)p_Var16 * 8) = dVar22;
              pdVar15 = pdVar15 + 0x10;
            }
          }
          else {
            uVar21 = puVar4[(long)pVVar11];
            p_Var9 = p_Var16 + 4;
            if (count <= p_Var16 + 4) {
              p_Var9 = count;
            }
            if (uVar21 == 0xffffffffffffffff) goto LAB_00d61c26;
            p_Var10 = p_Var9;
            if (uVar21 != 0) {
              pdVar15 = pdVar18 + (long)p_Var16 * 0x10 + 8;
              pVVar12 = pVVar11;
              for (uVar17 = 0;
                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var16->_vptr__Sp_counted_base + uVar17), p_Var10 < p_Var9;
                  uVar17 = uVar17 + 1) {
                if ((uVar21 >> (uVar17 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar15;
                  left_00.value._0_8_ = *(undefined8 *)(pdVar15 + -8);
                  dVar22 = BinaryLambdaWrapper::
                           Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                     (&cached,left_00,*(double *)score_cutoff.data,pVVar12,
                                      (idx_t)args);
                  *(double *)(pdVar19 + uVar17 * 8 + (long)p_Var16 * 8) = dVar22;
                }
                pdVar15 = pdVar15 + 0x10;
              }
            }
          }
          p_Var16 = p_Var10;
        }
      }
    }
    else if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && score_cutoff.vector_type == FLAT_VECTOR) {
      paVar3 = (anon_union_16_2_67f50693_for_value *)constant->data;
      puVar4 = (constant->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) goto LAB_00d61f13;
      Vector::SetVectorType(other,FLAT_VECTOR);
      pdVar18 = other->data;
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(&score_cutoff);
      FlatVector::SetValidity(other,&score_cutoff.validity);
      if ((other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
          dVar22 = BinaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                             (&cached,(string_t)paVar3->pointer,
                              *(double *)(score_cutoff.data + (long)p_Var16 * 8),pVVar11,(idx_t)args
                             );
          *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
        }
      }
      else {
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        for (pVVar11 = (ValidityMask *)0x0;
            pVVar11 != (ValidityMask *)((ulong)((long)&count[3]._M_weak_count + 3U) >> 6);
            pVVar11 = (ValidityMask *)
                      ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1)) {
          puVar4 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pVVar12 = pVVar11;
          if (puVar4 == (unsigned_long *)0x0) {
            p_Var9 = p_Var16 + 4;
            if (count <= p_Var16 + 4) {
              p_Var9 = count;
            }
LAB_00d621ed:
            for (; p_Var10 = p_Var16, p_Var16 < p_Var9;
                p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
              dVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                 (&cached,(string_t)paVar3->pointer,
                                  *(double *)(score_cutoff.data + (long)p_Var16 * 8),pVVar12,
                                  (idx_t)args);
              *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
            }
          }
          else {
            uVar21 = puVar4[(long)pVVar11];
            p_Var9 = p_Var16 + 4;
            if (count <= p_Var16 + 4) {
              p_Var9 = count;
            }
            if (uVar21 == 0xffffffffffffffff) goto LAB_00d621ed;
            p_Var10 = p_Var9;
            if (uVar21 != 0) {
              for (uVar17 = 0;
                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var16->_vptr__Sp_counted_base + uVar17), p_Var10 < p_Var9;
                  uVar17 = uVar17 + 1) {
                if ((uVar21 >> (uVar17 & 0x3f) & 1) != 0) {
                  dVar22 = BinaryLambdaWrapper::
                           Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                     (&cached,(string_t)paVar3->pointer,
                                      *(double *)
                                       (score_cutoff.data + uVar17 * 8 + (long)p_Var16 * 8),pVVar12,
                                      (idx_t)args);
                  *(double *)(pdVar18 + uVar17 * 8 + (long)p_Var16 * 8) = dVar22;
                }
              }
            }
          }
          p_Var16 = p_Var10;
        }
      }
    }
    else {
      pVVar11 = (ValidityMask *)CONCAT71(uVar14,score_cutoff.vector_type | VVar1);
      if ((score_cutoff.vector_type | VVar1) == FLAT_VECTOR) {
        pdVar18 = constant->data;
        Vector::SetVectorType(other,FLAT_VECTOR);
        pdVar19 = other->data;
        FlatVector::VerifyFlatVector(other);
        FlatVector::VerifyFlatVector(constant);
        FlatVector::SetValidity(other,&constant->validity);
        FlatVector::VerifyFlatVector(&score_cutoff);
        pVVar12 = &other->validity;
        ValidityMask::Combine(pVVar12,&score_cutoff.validity,(idx_t)count);
        if ((pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          pdVar18 = pdVar18 + 8;
          for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
            left_06.value.pointer.ptr = (char *)*(undefined8 *)pdVar18;
            left_06.value._0_8_ = *(undefined8 *)(pdVar18 + -8);
            dVar22 = BinaryLambdaWrapper::
                     Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                               (&cached,left_06,*(double *)(score_cutoff.data + (long)p_Var16 * 8),
                                pVVar11,(idx_t)args);
            *(double *)(pdVar19 + (long)p_Var16 * 8) = dVar22;
            pdVar18 = pdVar18 + 0x10;
          }
        }
        else {
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          for (pVVar11 = (ValidityMask *)0x0;
              pVVar11 != (ValidityMask *)((ulong)((long)&count[3]._M_weak_count + 3U) >> 6);
              pVVar11 = (ValidityMask *)
                        ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1)) {
            puVar4 = (pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              p_Var9 = p_Var16 + 4;
              if (count <= p_Var16 + 4) {
                p_Var9 = count;
              }
LAB_00d62390:
              pdVar15 = pdVar18 + (long)p_Var16 * 0x10 + 8;
              pVVar13 = pVVar11;
              for (; p_Var10 = p_Var16, p_Var16 < p_Var9;
                  p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
                left_03.value.pointer.ptr = (char *)*(undefined8 *)pdVar15;
                left_03.value._0_8_ = *(undefined8 *)(pdVar15 + -8);
                dVar22 = BinaryLambdaWrapper::
                         Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                   (&cached,left_03,
                                    *(double *)(score_cutoff.data + (long)p_Var16 * 8),pVVar13,
                                    (idx_t)args);
                *(double *)(pdVar19 + (long)p_Var16 * 8) = dVar22;
                pdVar15 = pdVar15 + 0x10;
              }
            }
            else {
              uVar21 = puVar4[(long)pVVar11];
              p_Var9 = p_Var16 + 4;
              if (count <= p_Var16 + 4) {
                p_Var9 = count;
              }
              if (uVar21 == 0xffffffffffffffff) goto LAB_00d62390;
              p_Var10 = p_Var9;
              if (uVar21 != 0) {
                pdVar15 = pdVar18 + (long)p_Var16 * 0x10 + 8;
                pVVar13 = pVVar11;
                for (uVar17 = 0;
                    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              ((long)&p_Var16->_vptr__Sp_counted_base + uVar17), p_Var10 < p_Var9;
                    uVar17 = uVar17 + 1) {
                  if ((uVar21 >> (uVar17 & 0x3f) & 1) != 0) {
                    left_04.value.pointer.ptr = (char *)*(undefined8 *)pdVar15;
                    left_04.value._0_8_ = *(undefined8 *)(pdVar15 + -8);
                    dVar22 = BinaryLambdaWrapper::
                             Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                       (&cached,left_04,
                                        *(double *)
                                         (score_cutoff.data + uVar17 * 8 + (long)p_Var16 * 8),
                                        pVVar13,(idx_t)args);
                    *(double *)(pdVar19 + uVar17 * 8 + (long)p_Var16 * 8) = dVar22;
                  }
                  pdVar15 = pdVar15 + 0x10;
                }
              }
            }
            p_Var16 = p_Var10;
          }
        }
      }
      else {
        UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
        Vector::ToUnifiedFormat(constant,(idx_t)count,&ldata);
        Vector::ToUnifiedFormat(&score_cutoff,(idx_t)count,&local_b8);
        Vector::SetVectorType(other,FLAT_VECTOR);
        pSVar7 = ldata.sel;
        pdVar18 = other->data;
        FlatVector::VerifyFlatVector(other);
        if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
            psVar6 = pSVar7->sel_vector;
            p_Var9 = p_Var16;
            if (psVar6 != (sel_t *)0x0) {
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar6[(long)p_Var16];
            }
            p_Var10 = p_Var16;
            if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (ulong)(local_b8.sel)->sel_vector[(long)p_Var16];
            }
            left_01.value.pointer.ptr =
                 (char *)*(undefined8 *)(ldata.data + (long)p_Var9 * 0x10 + 8);
            left_01.value._0_8_ = *(undefined8 *)(ldata.data + (long)p_Var9 * 0x10);
            dVar22 = BinaryLambdaWrapper::
                     Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                               (&cached,left_01,*(double *)(local_b8.data + (long)p_Var10 * 8),
                                (ValidityMask *)p_Var10,(idx_t)args);
            *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
          }
        }
        else {
          for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; count != p_Var16;
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
            psVar6 = pSVar7->sel_vector;
            p_Var9 = p_Var16;
            if (psVar6 != (sel_t *)0x0) {
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar6[(long)p_Var16];
            }
            p_Var10 = p_Var16;
            if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (ulong)(local_b8.sel)->sel_vector[(long)p_Var16];
            }
            if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [(ulong)p_Var9 >> 6] >> ((ulong)p_Var9 & 0x3f) & 1) != 0)) &&
               ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [(ulong)p_Var10 >> 6] >> ((ulong)p_Var10 & 0x3f) & 1) != 0)))) {
              left_05.value.pointer.ptr =
                   (char *)*(undefined8 *)(ldata.data + (long)p_Var9 * 0x10 + 8);
              left_05.value._0_8_ = *(undefined8 *)(ldata.data + (long)p_Var9 * 0x10);
              dVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                 (&cached,left_05,*(double *)(local_b8.data + (long)p_Var10 * 8),
                                  (ValidityMask *)p_Var10,(idx_t)args);
              *(double *)(pdVar18 + (long)p_Var16 * 8) = dVar22;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(other->validity).super_TemplatedValidityMask<unsigned_long>,
                         (idx_t)p_Var16);
            }
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&local_b8);
        UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      }
    }
    Vector::~Vector(&score_cutoff);
  }
  duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>::~CachedJaroWinklerSimilarity(&cached);
  ::std::__cxx11::string::~string((string *)&str_val);
LAB_00d620fa:
  Value::~Value(&val);
  return;
}

Assistant:

static void CachedFunction(Vector &constant, Vector &other, Vector &result, DataChunk &args) {
	auto val = constant.GetValue(0);
	idx_t count = args.size();
	if (val.IsNull()) {
		auto &result_validity = FlatVector::Validity(result);
		result_validity.SetAllInvalid(count);
		return;
	}

	auto str_val = StringValue::Get(val);
	auto cached = CACHED_SIMILARITY(str_val);

	D_ASSERT(args.ColumnCount() == 2 || args.ColumnCount() == 3);
	if (args.ColumnCount() == 2) {
		UnaryExecutor::Execute<string_t, double>(other, result, count, [&](const string_t &other_str) {
			auto other_str_begin = other_str.GetData();
			return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize());
		});
	} else {
		auto score_cutoff = args.data[2];
		BinaryExecutor::Execute<string_t, double_t, double>(
		    other, score_cutoff, result, count, [&](const string_t &other_str, const double_t score_cutoff) {
			    auto other_str_begin = other_str.GetData();
			    return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize(), score_cutoff);
		    });
	}
}